

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O0

CallResultWrap * tapi_query(void *h,char *account_id,char *command,char *data)

{
  bool bVar1;
  CallResultWrap *this;
  element_type *src;
  char *pcVar2;
  CallResultWrap *cr;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  TradeApi *tapi;
  char *data_local;
  char *command_local;
  char *account_id_local;
  void *h_local;
  
  r._40_8_ = h;
  if (h != (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,account_id,&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,command,&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,data,(allocator *)((long)&cr + 7));
    (**(code **)(*h + 0x68))(local_60,h,local_80,local_b8,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cr + 7));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    this = (CallResultWrap *)operator_new(0x10c);
    CallResultWrap::CallResultWrap(this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar1) {
      src = std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
      pcVar2 = _T(src,&this->text);
      this->value = pcVar2;
      this->value_type = 5;
    }
    else {
      pcVar2 = _T((string *)
                  &r.value.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,&this->_msg);
      this->msg = pcVar2;
    }
    tquant::api::
    CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~CallResult((CallResult<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60);
    return this;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x1b7,
                "CallResultWrap *tapi_query(void *, const char *, const char *, const char *)");
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_query(void* h, const char* account_id, const char* command, const char* data)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->query(account_id, command, data);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
		cr->value = _T(*r.value, cr->text);
        cr->value_type = VT_STRING;
    }
    else {
        cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}